

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

uint128_wrapper *
fmt::v7::detail::dragonbox::cache_accessor<double>::get_cached_power
          (uint128_wrapper *__return_storage_ptr__,int k)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint128_wrapper *puVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong high;
  long lVar8;
  uint64_t y;
  int iVar9;
  uint32_t error;
  int error_idx;
  ulong local_78;
  uint64_t middle_to_low;
  uint64_t high_to_middle;
  uint128_wrapper middle_low;
  uint128_wrapper recovered_cache;
  uint64_t pow5;
  uint128_wrapper *puStack_38;
  int alpha;
  uint128_wrapper base_cache;
  int offset;
  int kb;
  int cache_index;
  int k_local;
  
  iVar9 = (int)__return_storage_ptr__;
  if ((iVar9 < -0x124) || (0x146 < iVar9)) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x75e,"k is out of range");
  }
  iVar2 = (iVar9 + 0x124) / 0x1b;
  base_cache.internal_._12_4_ = iVar2 * 0x1b - 0x124;
  base_cache.internal_._8_4_ = iVar9 - base_cache.internal_._12_4_;
  lVar8 = (long)iVar2 * 0x10;
  puStack_38 = *(uint128_wrapper **)(basic_data<void>::dragonbox_pow10_significands_128 + lVar8);
  base_cache.internal_._0_8_ =
       *(undefined8 *)(basic_data<void>::dragonbox_pow10_significands_128 + lVar8 + 8);
  puVar5 = puStack_38;
  if (base_cache.internal_._8_4_ != 0) {
    iVar2 = floor_log2_pow10(base_cache.internal_._12_4_ + base_cache.internal_._8_4_);
    iVar3 = floor_log2_pow10(base_cache.internal_._12_4_);
    iVar2 = (iVar2 - iVar3) - base_cache.internal_._8_4_;
    if ((iVar2 < 1) || (0x3f < iVar2)) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/format-inl.h"
                  ,0x772,"shifting error detected");
    }
    uVar7 = *(uint64_t *)(basic_data<void>::powers_of_5_64 + (long)base_cache.internal_._8_4_ * 8);
    puVar5 = (uint128_wrapper *)uint128_wrapper::high((uint128_wrapper *)&stack0xffffffffffffffc8);
    middle_low.internal_._8_8_ = umul128(puVar5,uVar7,y);
    uVar6 = uint128_wrapper::low((uint128_wrapper *)&stack0xffffffffffffffc8);
    high_to_middle =
         (uint64_t)
         umul128((uint128_wrapper *)(uVar6 - ((int)base_cache.internal_._12_4_ < 0)),uVar7,
                 (ulong)base_cache.internal_._12_4_);
    uVar7 = uint128_wrapper::high((uint128_wrapper *)&high_to_middle);
    uint128_wrapper::operator+=((uint128_wrapper *)((long)&middle_low.internal_ + 8),uVar7);
    uVar7 = uint128_wrapper::high((uint128_wrapper *)((long)&middle_low.internal_ + 8));
    bVar1 = (byte)iVar2;
    middle_to_low = uVar7 << (0x40 - bVar1 & 0x3f);
    uVar7 = uint128_wrapper::low((uint128_wrapper *)((long)&middle_low.internal_ + 8));
    local_78 = uVar7 << (0x40 - bVar1 & 0x3f);
    uVar7 = uint128_wrapper::low((uint128_wrapper *)((long)&middle_low.internal_ + 8));
    high = uVar7 >> (bVar1 & 0x3f) | middle_to_low;
    uVar7 = uint128_wrapper::low((uint128_wrapper *)&high_to_middle);
    uint128_wrapper::uint128_wrapper
              ((uint128_wrapper *)&error,high,uVar7 >> (bVar1 & 0x3f) | local_78);
    middle_low.internal_._8_8_ = (uint128_wrapper *)_error;
    if ((int)base_cache.internal_._12_4_ < 0) {
      uint128_wrapper::operator+=((uint128_wrapper *)((long)&middle_low.internal_ + 8),1);
    }
    uVar4 = *(uint *)(basic_data<void>::dragonbox_pow10_recovery_errors +
                     (long)((iVar9 + 0x124) / 0x10) * 4) >>
            ((byte)((iVar9 + 0x124) % 0x10 << 1) & 0x1f) & 3;
    uVar7 = uint128_wrapper::low((uint128_wrapper *)((long)&middle_low.internal_ + 8));
    uVar6 = uint128_wrapper::low((uint128_wrapper *)((long)&middle_low.internal_ + 8));
    if (uVar7 + uVar4 < uVar6) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/format-inl.h"
                  ,0x78c,"");
    }
    uVar7 = uint128_wrapper::high((uint128_wrapper *)((long)&middle_low.internal_ + 8));
    uVar6 = uint128_wrapper::low((uint128_wrapper *)((long)&middle_low.internal_ + 8));
    uint128_wrapper::uint128_wrapper((uint128_wrapper *)&cache_index,uVar7,uVar6 + uVar4);
    puVar5 = _cache_index;
  }
  _cache_index = puVar5;
  return _cache_index;
}

Assistant:

static uint128_wrapper get_cached_power(int k) FMT_NOEXCEPT {
    FMT_ASSERT(k >= float_info<double>::min_k && k <= float_info<double>::max_k,
               "k is out of range");

#if FMT_USE_FULL_CACHE_DRAGONBOX
    return data::dragonbox_pow10_significands_128[k -
                                                  float_info<double>::min_k];
#else
    static const int compression_ratio = 27;

    // Compute base index.
    int cache_index = (k - float_info<double>::min_k) / compression_ratio;
    int kb = cache_index * compression_ratio + float_info<double>::min_k;
    int offset = k - kb;

    // Get base cache.
    uint128_wrapper base_cache =
        data::dragonbox_pow10_significands_128[cache_index];
    if (offset == 0) return base_cache;

    // Compute the required amount of bit-shift.
    int alpha = floor_log2_pow10(kb + offset) - floor_log2_pow10(kb) - offset;
    FMT_ASSERT(alpha > 0 && alpha < 64, "shifting error detected");

    // Try to recover the real cache.
    uint64_t pow5 = data::powers_of_5_64[offset];
    uint128_wrapper recovered_cache = umul128(base_cache.high(), pow5);
    uint128_wrapper middle_low =
        umul128(base_cache.low() - (kb < 0 ? 1u : 0u), pow5);

    recovered_cache += middle_low.high();

    uint64_t high_to_middle = recovered_cache.high() << (64 - alpha);
    uint64_t middle_to_low = recovered_cache.low() << (64 - alpha);

    recovered_cache =
        uint128_wrapper{(recovered_cache.low() >> alpha) | high_to_middle,
                        ((middle_low.low() >> alpha) | middle_to_low)};

    if (kb < 0) recovered_cache += 1;

    // Get error.
    int error_idx = (k - float_info<double>::min_k) / 16;
    uint32_t error = (data::dragonbox_pow10_recovery_errors[error_idx] >>
                      ((k - float_info<double>::min_k) % 16) * 2) &
                     0x3;

    // Add the error back.
    FMT_ASSERT(recovered_cache.low() + error >= recovered_cache.low(), "");
    return {recovered_cache.high(), recovered_cache.low() + error};
#endif
  }